

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::DumpStatementMaps(FunctionBody *this)

{
  uint uVar1;
  StatementMap *pSVar2;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type *pTVar3;
  uint index;
  
  this_00 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
  if (this_00 !=
      (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    Output::Print(L"Statement Map:\nstatementId, SourceSpan, ByteCodeSpan\n");
    uVar1 = (this_00->
            super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>)
            .count;
    if (0 < (int)uVar1) {
      index = 0;
      do {
        pTVar3 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this_00,index);
        pSVar2 = pTVar3->ptr;
        Output::Print(L"S%4d, (C%5d, C%5d)  (B%5d, B%5d) Inner=%d\n",(ulong)index,
                      (ulong)(uint)(pSVar2->sourceSpan).begin,(ulong)(uint)(pSVar2->sourceSpan).end,
                      (ulong)(uint)(pSVar2->byteCodeSpan).begin,
                      (ulong)(uint)(pSVar2->byteCodeSpan).end,(uint)pSVar2->isSubexpression);
        index = index + 1;
      } while (uVar1 != index);
    }
  }
  return;
}

Assistant:

void FunctionBody::DumpStatementMaps()
    {
        // Source Map to ByteCode
        StatementMapList * pStatementMaps = this->GetStatementMaps();
        if (pStatementMaps)
        {
            Output::Print(_u("Statement Map:\nstatementId, SourceSpan, ByteCodeSpan\n"));
            int count = pStatementMaps->Count();
            for(int i = 0; i < count; i++)
            {
                StatementMap* map = pStatementMaps->Item(i);

                Output::Print(_u("S%4d, (C%5d, C%5d)  (B%5d, B%5d) Inner=%d\n"), i,
                                                      map->sourceSpan.begin,
                                                      map->sourceSpan.end,
                                                      map->byteCodeSpan.begin,
                                                      map->byteCodeSpan.end,
                                                      map->isSubexpression);
            }
        }
    }